

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O0

void __thiscall
Bezier<3,_2>::Bezier
          (Bezier<3,_2> *this,initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list)

{
  PointsType *local_20;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list_local;
  Bezier<3,_2> *this_local;
  
  Curve<3,_2>::Curve(&this->super_Curve<3,_2>);
  (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)&PTR_computeLength_00126d08;
  local_20 = this->derivative_precal_points_;
  do {
    Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (PointsType *)this->derivative_precal_prefix_);
  set(this,list);
  return;
}

Assistant:

Bezier(const std::initializer_list<PointType>& list) { set(std::forward<decltype(list)>(list)); }